

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O1

void __thiscall
CVmImagePool::vmpbs_load_page
          (CVmImagePool *this,pool_ofs_t ofs,size_t param_2,size_t load_size,char *mem)

{
  byte bVar1;
  CVmImagePool_pg *pCVar2;
  undefined1 auVar3 [16];
  size_t sVar4;
  
  auVar3._8_8_ = 0;
  auVar3._0_8_ = this->page_size_;
  pCVar2 = this->page_info_[SUB168(ZEXT416(ofs) / auVar3,0) >> 0xc];
  seek_page_ofs(this,ofs);
  (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,mem,load_size);
  if ((load_size != 0) &&
     (bVar1 = pCVar2[SUB164(ZEXT416(ofs) / auVar3,0) & 0xfff].xor_mask, bVar1 != 0)) {
    sVar4 = 0;
    do {
      mem[sVar4] = mem[sVar4] ^ bVar1;
      sVar4 = sVar4 + 1;
    } while (load_size != sVar4);
  }
  return;
}

Assistant:

void CVmImagePool::vmpbs_load_page(pool_ofs_t ofs, size_t /*page_size*/,
                                   size_t load_size, char *mem)
{
    CVmImagePool_pg *info;

    /* get the page information */
    info = get_page_info_ofs(ofs);

    /* seek to the correct location in the image file */
    seek_page_ofs(ofs);

    /* ask the underlying file to load the data */
    fp_->copy_data(mem, load_size);

    /* apply the XOR mask to the loaded data */
    apply_xor_mask(mem, load_size, info->xor_mask);
}